

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmFTrapcc<(moira::Instr)202,(moira::Mode)12,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  bool bVar1;
  StrWriter *pSVar2;
  Fcc local_34;
  byte local_2d;
  u32 local_2c;
  u32 uStack_28;
  u8 cnd;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uStack_28 = *addr;
  ext._2_2_ = op;
  _old = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  local_2c = dasmIncRead<2>(this,addr);
  local_2d = (byte)local_2c & 0x3f;
  if (((**(int **)(addr_local + 0xc) != 2) && (**(int **)(addr_local + 0xc) != 3)) ||
     (bVar1 = isValidExtFPU(this,FTRAPcc,IP,ext._2_2_,local_2c), bVar1)) {
    pSVar2 = StrWriter::operator<<((StrWriter *)addr_local);
    Fcc::Fcc(&local_34,(uint)local_2d);
    pSVar2 = StrWriter::operator<<(pSVar2,local_34);
    StrWriter::operator<<(pSVar2," ");
  }
  else {
    *_old = uStack_28;
    dasmIllegal<(moira::Instr)202,(moira::Mode)12,0>(this,(StrWriter *)addr_local,_old,ext._2_2_);
  }
  return;
}

Assistant:

void
Moira::dasmFTrapcc(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto cnd = __________xxxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    switch (S) {

        case Unsized:

            str << Ins<I>{} << Fcc{cnd} << " ";
            break;

        case Word:
        case Long:

            str << Ins<I>{} << Fcc{cnd} << Sz<S>{} << str.tab << Ims<S>(dasmIncRead<S>(addr));
            break;
    }
}